

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

bool legacy::getSlicingCriteriaNodes
               (LLVMDependenceGraph *dg,string *slicingCriteria,string *secondarySlicingCriteria,
               set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
               *criteria_nodes,bool criteria_are_next_instr)

{
  long lVar1;
  ulong uVar2;
  pointer pcVar3;
  LLVMNode *pLVar4;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  iVar5;
  pointer ppVar6;
  pointer pbVar7;
  undefined8 uVar8;
  bool bVar9;
  __type _Var10;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  raw_ostream *prVar13;
  long lVar14;
  Instruction *pIVar15;
  _Base_ptr p_Var16;
  _Rb_tree_node_base *p_Var17;
  BBlock<dg::LLVMNode> *pBVar18;
  long *plVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  SymbolTableList<llvm::BasicBlock> *pSVar22;
  SymbolTableList<llvm::BasicBlock> *pSVar23;
  iterator __end1;
  pointer ppVar24;
  Value *pVVar25;
  char *Str;
  iterator __begin1;
  long *plVar26;
  StringRef SVar27;
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar28;
  InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
  __end2;
  int line;
  undefined4 uStack_1d4;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  iStack_1d0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_1c8;
  _Rb_tree_node_base *local_1c0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parsedCrit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  node_criteria;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> nodes;
  LLVMNode *local_120;
  pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  secondaryCriteria;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  control_criteria;
  _Base_ptr local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_criteria;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &nodes._M_t._M_impl.super__Rb_tree_header._M_header;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  splitList(&criteria,slicingCriteria,',');
  line_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  line_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_criteria.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  control_criteria._M_t._M_impl._0_8_ = 0;
  control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       std::
       _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
       ::_M_invoke;
  control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
       ::_M_manager;
  splitStringVector((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&secondaryCriteria,&criteria,
                    (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&control_criteria);
  parsedCrit.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&node_criteria;
  parsedCrit.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&line_criteria;
  std::
  tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
  ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               *)&parsedCrit,
              (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&secondaryCriteria);
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&secondaryCriteria);
  if (control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (*(code *)control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
              (&control_criteria,&control_criteria,3);
  }
  pbVar7 = node_criteria.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar20 = node_criteria.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar7; pbVar20 = pbVar20 + 1
      ) {
    bVar9 = std::operator==(pbVar20,"ret");
    if (bVar9) {
      lVar14 = *(long *)(dg + 0x20);
      for (p_Var12 = *(_Rb_tree_node_base **)(lVar14 + 0xe8);
          p_Var12 != (_Rb_tree_node_base *)(lVar14 + 0xd8);
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        std::
        _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
        ::_M_insert_unique<dg::LLVMNode*const&>
                  ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                    *)&nodes,(LLVMNode **)(p_Var12 + 1));
      }
    }
  }
  if (node_criteria.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      node_criteria.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::dg::LLVMDependenceGraph::getCallSites((vector *)&node_criteria,(set *)&nodes);
  }
  pbVar7 = line_criteria.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (line_criteria.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      line_criteria.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (pbVar20 = line_criteria.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar7;
        pbVar20 = pbVar20 + 1) {
      splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&secondaryCriteria,pbVar20,':');
      uVar8 = secondaryCriteria.first._M_t._M_impl._0_8_;
      if (*(long *)(secondaryCriteria.first._M_t._M_impl._0_8_ + 8) == 0) {
        _line = (pointer)CONCAT44(uStack_1d4,0xffffffff);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<int,std::__cxx11::string&>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)&parsedCrit,&line,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (secondaryCriteria.first._M_t._M_impl._0_8_ + 0x20));
      }
      else {
        bVar9 = isNumber((string *)secondaryCriteria.first._M_t._M_impl._0_8_);
        if (bVar9) {
          iVar11 = atoi(*(char **)uVar8);
          _line = (pointer)CONCAT44(uStack_1d4,iVar11);
          if (0 < iVar11) {
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<int&,std::__cxx11::string&>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)&parsedCrit,&line,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (uVar8 + 0x20));
          }
        }
        else {
          prVar13 = (raw_ostream *)llvm::errs();
          prVar13 = llvm::raw_ostream::operator<<(prVar13,"Invalid line: \'");
          prVar13 = llvm::raw_ostream::operator<<
                              (prVar13,(string *)secondaryCriteria.first._M_t._M_impl._0_8_);
          prVar13 = llvm::raw_ostream::operator<<(prVar13,"\'. ");
          llvm::raw_ostream::operator<<
                    (prVar13,"Needs to be a number or empty for global variables.\n");
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&secondaryCriteria);
    }
    initDebugInfo(dg);
    lVar14 = *(long *)(dg + 0x140);
    plVar19 = (long *)(lVar14 + 0x10);
    while (ppVar6 = parsedCrit.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, lVar1 = *plVar19,
          lVar1 != lVar14 + 8) {
      pVVar25 = (Value *)(lVar1 + -0x38);
      ppVar24 = parsedCrit.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar1 == 0) {
        pVVar25 = (Value *)0x0;
      }
      for (; ppVar24 != ppVar6; ppVar24 = ppVar24 + 1) {
        if (ppVar24->first == -1) {
          SVar27 = (StringRef)llvm::Value::getName();
          _line = SVar27;
          llvm::StringRef::str_abi_cxx11_((string *)&secondaryCriteria,(StringRef *)&line);
          _Var10 = std::operator==(&ppVar24->second,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&secondaryCriteria);
          std::__cxx11::string::_M_dispose();
          if (_Var10) {
            prVar13 = (raw_ostream *)llvm::errs();
            prVar13 = llvm::raw_ostream::operator<<(prVar13,"Matched global variable ");
            prVar13 = llvm::raw_ostream::operator<<(prVar13,&ppVar24->second);
            prVar13 = llvm::raw_ostream::operator<<(prVar13," to:\n");
            prVar13 = llvm::operator<<(prVar13,pVVar25);
            llvm::raw_ostream::operator<<(prVar13,"\n");
            secondaryCriteria.first._M_t._M_impl._0_8_ =
                 ::dg::DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
                           ((DependenceGraph<dg::LLVMNode> *)dg,pVVar25);
            std::
            _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
            ::_M_insert_unique<dg::LLVMNode*const&>
                      ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                        *)&nodes,(LLVMNode **)&secondaryCriteria);
            break;
          }
        }
      }
      plVar19 = (long *)(lVar1 + 8);
    }
    if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar14 = ::dg::getConstructedFunctions();
      p_Var12 = *(_Rb_tree_node_base **)(lVar14 + 0x18);
      while (p_Var12 != (_Rb_tree_node_base *)(lVar14 + 8)) {
        llvm::instructions((inst_range *)&secondaryCriteria,*(Function **)(p_Var12 + 1));
        local_1c8.NodePtr =
             (node_pointer)
             secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        iStack_1d0.NodePtr =
             (node_pointer)
             CONCAT44(secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_color)
        ;
        _line = (pointer)secondaryCriteria.first._M_t._M_impl._0_8_;
        __end2.BI.NodePtr =
             (node_pointer)secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end2.BBs = (SymbolTableList<llvm::BasicBlock> *)
                     secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        __end2.BB.NodePtr =
             (node_pointer)
             secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        while (bVar9 = llvm::
                       InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                       ::operator!=((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                     *)&line,&__end2),
              ppVar6 = parsedCrit.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish, bVar9) {
          pIVar15 = (Instruction *)&((_Base_ptr)(local_1c8.NodePtr + -2))->_M_parent;
          if ((_Base_ptr)local_1c8.NodePtr == (_Base_ptr)0x0) {
            pIVar15 = (Instruction *)0x0;
          }
          for (ppVar24 = parsedCrit.
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar24 != ppVar6;
              ppVar24 = ppVar24 + 1) {
            if ((*(long *)(pIVar15 + 0x30) != 0) &&
               (iVar11 = llvm::DebugLoc::getLine(), iVar11 == ppVar24->first)) {
              pbVar21 = &ppVar24->second;
              bVar9 = instIsCallOf(pIVar15,pbVar21,*(LLVMPointerAnalysis **)(dg + 0x148));
              if (bVar9) {
                Str = " with call of ";
              }
              else {
                bVar9 = usesTheVariable(pIVar15,pbVar21,*(long *)(dg + 0x148) != 0,
                                        (LLVMPointerAnalysis *)0x0);
                if (!bVar9) goto LAB_001399d2;
                Str = " with variable ";
              }
              prVar13 = (raw_ostream *)llvm::errs();
              prVar13 = llvm::raw_ostream::operator<<(prVar13,"Matched line ");
              prVar13 = llvm::raw_ostream::operator<<(prVar13,ppVar24->first);
              prVar13 = llvm::raw_ostream::operator<<(prVar13,Str);
              prVar13 = llvm::raw_ostream::operator<<(prVar13,pbVar21);
              prVar13 = llvm::raw_ostream::operator<<(prVar13," to:\n");
              prVar13 = llvm::operator<<(prVar13,(Value *)pIVar15);
              llvm::raw_ostream::operator<<(prVar13,"\n");
              local_120 = ::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                                    ((DependenceGraph<dg::LLVMNode> *)p_Var12[1]._M_parent,
                                     (Value *)pIVar15);
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)&nodes,&local_120);
              break;
            }
LAB_001399d2:
          }
          llvm::
          InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
          ::operator++((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                        *)&line);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      }
    }
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&parsedCrit);
  }
  if ((criteria_are_next_instr) && (nodes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header;
    secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var16 = nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         secondaryCriteria.first._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var16 != &nodes._M_t._M_impl.super__Rb_tree_header) {
      plVar19 = *(long **)(p_Var16 + 1);
      pVVar25 = (Value *)*plVar19;
      if ((byte)pVVar25[0x10] < 0x1b) {
        pVVar25 = (Value *)0x0;
      }
      pIVar15 = llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getNextNode
                          ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)
                           (pVVar25 + 0x18));
      if (pIVar15 == (Instruction *)0x0) {
        prVar13 = (raw_ostream *)llvm::errs();
        prVar13 = llvm::operator<<(prVar13,pVVar25);
        llvm::raw_ostream::operator<<(prVar13,"has no successor that could be criterion\n");
        abort();
      }
      parsedCrit.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                              ((DependenceGraph<dg::LLVMNode> *)plVar19[1],(Value *)pIVar15);
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>
                ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)&secondaryCriteria,(LLVMNode **)&parsedCrit);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::swap(&nodes._M_t,
           (_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
            *)&secondaryCriteria);
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::~_Rb_tree((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                 *)&secondaryCriteria);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&node_criteria);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&line_criteria);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&criteria);
  if (nodes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::swap(&criteria_nodes->_M_t,&nodes._M_t);
    splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&line,secondarySlicingCriteria,',');
    iVar5.NodePtr = iStack_1d0.NodePtr;
    control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &control_criteria._M_t._M_impl.super__Rb_tree_header._M_header;
    control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    control_criteria._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)parsedCrit.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pbVar21 = _line;
        pbVar21 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.NodePtr;
        pbVar21 = pbVar21 + 1) {
      uVar2 = pbVar21->_M_string_length;
      if (((uVar2 < 3) || (pcVar3 = (pbVar21->_M_dataplus)._M_p, pcVar3[uVar2 - 2] != '(')) ||
         (pcVar3[uVar2 - 1] != ')')) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&control_criteria,pbVar21);
      }
      else {
        std::__cxx11::string::substr((ulong)&secondaryCriteria,(ulong)pbVar21);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&parsedCrit,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &secondaryCriteria);
        std::__cxx11::string::_M_dispose();
      }
    }
    std::
    pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
              (&secondaryCriteria,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&control_criteria._M_t,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parsedCrit);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parsedCrit);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&control_criteria._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&line);
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)parsedCrit.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    parsedCrit.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    stack<dg::BBlock<dg::LLVMNode>*,std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>>
    ::stack<std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>,void>
              ((stack<dg::BBlock<dg::LLVMNode>_*,_std::deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>_>
                *)&control_criteria);
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_Rb_tree((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)&line,&criteria_nodes->_M_t);
    p_Var12 = local_1c0;
    while (p_Var12 != (_Rb_tree_node_base *)&iStack_1d0) {
      if (*(SymbolTableList<llvm::BasicBlock> **)(*(long *)(p_Var12 + 1) + 0x1d0) !=
          (SymbolTableList<llvm::BasicBlock> *)0x0) {
        __end2.BBs = *(SymbolTableList<llvm::BasicBlock> **)(*(long *)(p_Var12 + 1) + 0x1d0);
        std::deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
        push_back((deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_> *)
                  &control_criteria,(value_type *)&__end2);
        __end2.BBs = *(SymbolTableList<llvm::BasicBlock> **)(*(long *)(p_Var12 + 1) + 0x1d0);
        std::
        _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
        ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*>
                  ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                    *)&parsedCrit,(BBlock<dg::LLVMNode> **)&__end2);
        plVar26 = (long *)(*(long *)(*(long *)(p_Var12 + 1) + 0x1d0) + 0x10);
        plVar19 = plVar26;
        while ((plVar19 = (long *)*plVar19, plVar19 != plVar26 &&
               (pLVar4 = (LLVMNode *)plVar19[2], pLVar4 != *(LLVMNode **)(p_Var12 + 1)))) {
          if (*(long *)(pLVar4 + 0x1b8) != 0) {
            p_Var17 = *(_Rb_tree_node_base **)(pLVar4 + 0x1a8);
            while (p_Var17 != (_Rb_tree_node_base *)(pLVar4 + 0x198)) {
              __end2.BBs = *(SymbolTableList<llvm::BasicBlock> **)(*(long *)(p_Var17 + 1) + 0x98);
              pVar28 = std::
                       _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                       ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                 ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                   *)&parsedCrit,(BBlock<dg::LLVMNode> **)&__end2);
              if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                ::push_back((deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                             *)&control_criteria,(value_type *)&__end2);
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
            }
          }
          checkSecondarySlicingCrit
                    (criteria_nodes,&secondaryCriteria.first,&secondaryCriteria.second,pLVar4);
        }
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    }
    while (local_88 != control_criteria._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      pBVar18 = ::dg::ADT::QueueLIFO<dg::BBlock<dg::LLVMNode>_*>::pop
                          ((QueueLIFO<dg::BBlock<dg::LLVMNode>_*> *)&control_criteria);
      p_Var12 = *(_Rb_tree_node_base **)(pBVar18 + 0x70);
      while (p_Var12 != (_Rb_tree_node_base *)(pBVar18 + 0x60)) {
        __end2.BBs = *(SymbolTableList<llvm::BasicBlock> **)(p_Var12 + 1);
        pSVar22 = __end2.BBs + 1;
        pSVar23 = pSVar22;
        while (pSVar23 = *(SymbolTableList<llvm::BasicBlock> **)pSVar23, pSVar23 != pSVar22) {
          pLVar4 = *(LLVMNode **)(pSVar23 + 1);
          if (*(long *)(pLVar4 + 0x1b8) != 0) {
            p_Var17 = *(_Rb_tree_node_base **)(pLVar4 + 0x1a8);
            while (p_Var17 != (_Rb_tree_node_base *)(pLVar4 + 0x198)) {
              criteria.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   *(pointer *)(*(long *)(p_Var17 + 1) + 0x98);
              pVar28 = std::
                       _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                       ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                 ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                   *)&parsedCrit,(BBlock<dg::LLVMNode> **)&criteria);
              if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                ::push_back((deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                             *)&control_criteria,(value_type *)&criteria);
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
            }
          }
          checkSecondarySlicingCrit
                    (criteria_nodes,&secondaryCriteria.first,&secondaryCriteria.second,pLVar4);
        }
        pVar28 = std::
                 _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                 ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                           ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                             *)&parsedCrit,(BBlock<dg::LLVMNode> **)&__end2);
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
          push_back((deque<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                     *)&control_criteria,(value_type *)&__end2);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      }
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::~_Rb_tree((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                 *)&line);
    std::_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
    ~_Deque_base((_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                  *)&control_criteria);
    std::
    _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
    ::~_Rb_tree((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                 *)&parsedCrit);
    std::
    pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair(&secondaryCriteria);
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::~_Rb_tree(&nodes._M_t);
  return true;
}

Assistant:

bool getSlicingCriteriaNodes(LLVMDependenceGraph &dg,
                             const std::string &slicingCriteria,
                             const std::string &secondarySlicingCriteria,
                             std::set<LLVMNode *> &criteria_nodes,
                             bool criteria_are_next_instr) {
    auto nodes = getPrimarySlicingCriteriaNodes(dg, slicingCriteria,
                                                criteria_are_next_instr);
    if (nodes.empty()) {
        return true; // no criteria found
    }

    criteria_nodes.swap(nodes);

    auto secondaryCriteria =
            parseSecondarySlicingCriteria(secondarySlicingCriteria);
    const auto &secondaryControlCriteria = secondaryCriteria.first;
    const auto &secondaryDataCriteria = secondaryCriteria.second;

    // mark nodes that are going to be in the slice
    if (!findSecondarySlicingCriteria(criteria_nodes, secondaryControlCriteria,
                                      secondaryDataCriteria)) {
        llvm::errs() << "Finding secondary slicing criteria nodes failed\n";
        return false;
    }

    return true;
}